

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* read_all_lines_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,char *filename)

{
  char *pcVar1;
  __ssize_t _Var2;
  allocator local_69;
  string local_68 [8];
  string line;
  char *local_30;
  char *line_buf;
  size_t line_size;
  FILE *file;
  char *filename_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  
  file = (FILE *)filename;
  filename_local = (char *)__return_storage_ptr__;
  line_size = (size_t)fopen(filename,"r");
  line_buf = (char *)0x0;
  local_30 = (char *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while (_Var2 = getline(&local_30,(size_t *)&line_buf,(FILE *)line_size), pcVar1 = local_30,
        0 < _Var2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_68);
    std::__cxx11::string::~string(local_68);
  }
  free(local_30);
  local_30 = (char *)0x0;
  fclose((FILE *)line_size);
  return __return_storage_ptr__;
}

Assistant:

Vector<String> read_all_lines(const char * filename){
    FILE* file = fopen(filename, "r");
    size_t line_size=0;
    char* line_buf=0;
    Vector<String> lines;
    while (getline(&line_buf, &line_size, file)>0) {
        String line = line_buf;
        lines.push_back(line);
    }
    free(line_buf);
    line_buf=NULL;
    fclose(file);
    return lines;
}